

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O1

void __thiscall
prometheus::TextSerializer::Serialize
          (TextSerializer *this,ostream *out,
          vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *metrics)

{
  pointer pBVar1;
  pointer pLVar2;
  pointer pQVar3;
  pointer pCVar4;
  ostream *poVar5;
  size_t sVar6;
  char *pcVar7;
  pointer pMVar8;
  double *extraLabelValue;
  pointer pBVar9;
  pointer pLVar10;
  pointer extraLabelValue_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ClientMetric *metric;
  pointer pCVar13;
  locale saved_locale;
  string local_d0;
  string local_b0;
  pointer local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pointer local_68;
  locale local_60 [8];
  undefined8 local_58;
  pointer local_50;
  pointer local_48;
  locale local_40 [8];
  locale local_38 [8];
  
  std::locale::locale(local_60,(locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
  local_58 = *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8);
  std::locale::classic();
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 0x10;
  pMVar8 = (metrics->
           super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_50 = (metrics->
             super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar8 != local_50) {
    do {
      paVar11 = &local_88.field_2;
      if ((pMVar8->help)._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(out,"# HELP ",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(pMVar8->name)._M_dataplus._M_p,(pMVar8->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(pMVar8->help)._M_dataplus._M_p,(pMVar8->help)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      local_90 = pMVar8;
      switch(pMVar8->type) {
      case Counter:
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        pMVar8 = local_90;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(local_90->name)._M_dataplus._M_p,(local_90->name)._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," counter\n",9);
        pCVar4 = (pMVar8->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar13 = (pMVar8->metric).
                       super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar4;
            pCVar13 = pCVar13 + 1) {
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_88._M_string_length = 0;
          local_88.field_2._M_allocated_capacity._0_2_ =
               local_88.field_2._M_allocated_capacity._0_2_ & 0xff00;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_88._M_dataplus._M_p = (pointer)paVar11;
          (anonymous_namespace)::WriteHead<std::__cxx11::string>
                    (out,local_90,pCVar13,&local_b0,&local_d0,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar11) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          anon_unknown_3::WriteValue(out,(pCVar13->counter).value);
          anon_unknown_3::WriteTail(out,pCVar13);
        }
        break;
      case Gauge:
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        pMVar8 = local_90;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(local_90->name)._M_dataplus._M_p,(local_90->name)._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," gauge\n",7);
        pCVar4 = (pMVar8->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar13 = (pMVar8->metric).
                       super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar4;
            pCVar13 = pCVar13 + 1) {
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_88._M_string_length = 0;
          local_88.field_2._M_allocated_capacity._0_2_ =
               local_88.field_2._M_allocated_capacity._0_2_ & 0xff00;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_88._M_dataplus._M_p = (pointer)paVar11;
          (anonymous_namespace)::WriteHead<std::__cxx11::string>
                    (out,local_90,pCVar13,&local_b0,&local_d0,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar11) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          anon_unknown_3::WriteValue(out,(pCVar13->gauge).value);
          anon_unknown_3::WriteTail(out,pCVar13);
        }
        break;
      case Summary:
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        pMVar8 = local_90;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(local_90->name)._M_dataplus._M_p,(local_90->name)._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," summary\n",9);
        pCVar13 = (pMVar8->metric).
                  super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_68 = (pMVar8->metric).
                   super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar13 != local_68) {
          do {
            pMVar8 = local_90;
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            local_b0.field_2._M_local_buf[4] = 'n';
            local_b0.field_2._M_local_buf[5] = 't';
            local_b0.field_2._M_local_buf[0] = '_';
            local_b0.field_2._M_allocated_capacity._1_2_ = 0x6f63;
            local_b0.field_2._M_local_buf[3] = 'u';
            local_b0._M_string_length = 6;
            local_b0.field_2._M_local_buf[6] = '\0';
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_88._M_string_length = 0;
            local_88.field_2._M_allocated_capacity._0_2_ =
                 local_88.field_2._M_allocated_capacity._0_2_ & 0xff00;
            local_88._M_dataplus._M_p = (pointer)paVar11;
            (anonymous_namespace)::WriteHead<std::__cxx11::string>
                      (out,local_90,pCVar13,&local_b0,&local_d0,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar11) {
              operator_delete(local_88._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            std::ostream::_M_insert<unsigned_long>((ulong)out);
            anon_unknown_3::WriteTail(out,pCVar13);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            local_b0.field_2._M_local_buf[0] = '_';
            local_b0.field_2._M_allocated_capacity._1_2_ = 0x7573;
            local_b0.field_2._M_local_buf[3] = 'm';
            local_b0._M_string_length = 4;
            local_b0.field_2._M_local_buf[4] = '\0';
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_88._M_string_length = 0;
            local_88.field_2._M_allocated_capacity._0_2_ =
                 local_88.field_2._M_allocated_capacity._0_2_ & 0xff00;
            local_88._M_dataplus._M_p = (pointer)paVar11;
            (anonymous_namespace)::WriteHead<std::__cxx11::string>
                      (out,pMVar8,pCVar13,&local_b0,&local_d0,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar11) {
              operator_delete(local_88._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            anon_unknown_3::WriteValue(out,(pCVar13->summary).sample_sum);
            anon_unknown_3::WriteTail(out,pCVar13);
            pQVar3 = (pCVar13->summary).quantile.
                     super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (extraLabelValue_00 =
                      (pCVar13->summary).quantile.
                      super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                      ._M_impl.super__Vector_impl_data._M_start; extraLabelValue_00 != pQVar3;
                extraLabelValue_00 = extraLabelValue_00 + 1) {
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              local_b0._M_string_length = 0;
              local_b0.field_2._M_local_buf[0] = '\0';
              local_d0.field_2._M_allocated_capacity = 0x656c69746e617571;
              local_d0._M_string_length = 8;
              local_d0.field_2._M_local_buf[8] = '\0';
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              anon_unknown_3::WriteHead<double>
                        (out,local_90,pCVar13,&local_b0,&local_d0,&extraLabelValue_00->quantile);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
              anon_unknown_3::WriteValue(out,extraLabelValue_00->value);
              anon_unknown_3::WriteTail(out,pCVar13);
            }
            pCVar13 = pCVar13 + 1;
          } while (pCVar13 != local_68);
        }
        break;
      case Untyped:
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        pMVar8 = local_90;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(local_90->name)._M_dataplus._M_p,(local_90->name)._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," untyped\n",9);
        pCVar4 = (pMVar8->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar13 = (pMVar8->metric).
                       super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar4;
            pCVar13 = pCVar13 + 1) {
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_88._M_string_length = 0;
          local_88.field_2._M_allocated_capacity._0_2_ =
               local_88.field_2._M_allocated_capacity._0_2_ & 0xff00;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_88._M_dataplus._M_p = (pointer)paVar11;
          (anonymous_namespace)::WriteHead<std::__cxx11::string>
                    (out,local_90,pCVar13,&local_b0,&local_d0,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar11) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          anon_unknown_3::WriteValue(out,(pCVar13->untyped).value);
          anon_unknown_3::WriteTail(out,pCVar13);
        }
        break;
      case Histogram:
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        pMVar8 = local_90;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(local_90->name)._M_dataplus._M_p,(local_90->name)._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," histogram\n",0xb);
        pCVar13 = (pMVar8->metric).
                  super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_48 = (pMVar8->metric).
                   super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar13 != local_48) {
          do {
            paVar12 = &local_88.field_2;
            paVar11 = &local_b0.field_2;
            local_b0.field_2._M_local_buf[4] = 'n';
            local_b0.field_2._M_local_buf[5] = 't';
            local_b0.field_2._M_local_buf[0] = '_';
            local_b0.field_2._M_allocated_capacity._1_2_ = 0x6f63;
            local_b0.field_2._M_local_buf[3] = 'u';
            local_b0._M_string_length = 6;
            local_b0.field_2._M_local_buf[6] = '\0';
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_88._M_string_length = 0;
            local_88.field_2._M_allocated_capacity._0_2_ =
                 local_88.field_2._M_allocated_capacity._0_2_ & 0xff00;
            local_b0._M_dataplus._M_p = (pointer)paVar11;
            local_88._M_dataplus._M_p = (pointer)paVar12;
            (anonymous_namespace)::WriteHead<std::__cxx11::string>
                      (out,local_90,pCVar13,&local_b0,&local_d0,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar12) {
              operator_delete(local_88._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar11) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            std::ostream::_M_insert<unsigned_long>((ulong)out);
            anon_unknown_3::WriteTail(out,pCVar13);
            local_b0.field_2._M_local_buf[0] = '_';
            local_b0.field_2._M_allocated_capacity._1_2_ = 0x7573;
            local_b0.field_2._M_local_buf[3] = 'm';
            local_b0._M_string_length = 4;
            local_b0.field_2._M_local_buf[4] = '\0';
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_88._M_string_length = 0;
            local_88.field_2._M_allocated_capacity._0_2_ =
                 local_88.field_2._M_allocated_capacity._0_2_ & 0xff00;
            local_b0._M_dataplus._M_p = (pointer)paVar11;
            local_88._M_dataplus._M_p = (pointer)paVar12;
            (anonymous_namespace)::WriteHead<std::__cxx11::string>
                      (out,local_90,pCVar13,&local_b0,&local_d0,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar12) {
              operator_delete(local_88._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar11) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            anon_unknown_3::WriteValue(out,(pCVar13->histogram).sample_sum);
            anon_unknown_3::WriteTail(out,pCVar13);
            pBVar9 = (pCVar13->histogram).bucket.
                     super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pBVar1 = (pCVar13->histogram).bucket.
                     super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pBVar9 == pBVar1) {
LAB_0014ceca:
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              local_d0.field_2._M_allocated_capacity = 0x74656b6375625f;
              local_d0._M_string_length = 7;
              local_88.field_2._M_allocated_capacity._0_2_ = 0x656c;
              local_88._M_string_length = 2;
              local_88.field_2._M_local_buf[2] = '\0';
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (out,(local_90->name)._M_dataplus._M_p,
                                  (local_90->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,local_d0._M_dataplus._M_p,local_d0._M_string_length);
              if (((pCVar13->label).
                   super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (pCVar13->label).
                   super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish) || (local_88._M_string_length != 0))
              {
                std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
                pLVar10 = (pCVar13->label).
                          super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pLVar2 = (pCVar13->label).
                         super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pcVar7 = "";
                if (pLVar10 != pLVar2) {
                  pcVar7 = "";
                  do {
                    sVar6 = strlen(pcVar7);
                    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,sVar6);
                    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                       (out,(pLVar10->name)._M_dataplus._M_p,
                                        (pLVar10->name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=\"",2);
                    anon_unknown_3::WriteValue(out,&pLVar10->value);
                    std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
                    pLVar10 = pLVar10 + 1;
                    pcVar7 = ",";
                  } while (pLVar10 != pLVar2);
                  pcVar7 = ",";
                }
                if (local_88._M_string_length != 0) {
                  sVar6 = strlen(pcVar7);
                  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,sVar6);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     (out,local_88._M_dataplus._M_p,local_88._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=\"",2);
                  local_b0.field_2._M_local_buf[0] = '+';
                  local_b0.field_2._M_allocated_capacity._1_2_ = 0x6e49;
                  local_b0.field_2._M_local_buf[3] = 'f';
                  local_b0._M_string_length = 4;
                  local_b0.field_2._M_local_buf[4] = '\0';
                  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                  anon_unknown_3::WriteValue(out,&local_b0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
                }
                std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              std::ostream::_M_insert<unsigned_long>((ulong)out);
              anon_unknown_3::WriteTail(out,pCVar13);
            }
            else {
              extraLabelValue = &pBVar9->upper_bound;
              do {
                local_b0.field_2._M_local_buf[4] = 'k';
                local_b0.field_2._M_local_buf[5] = 'e';
                local_b0.field_2._M_local_buf[6] = 't';
                local_b0.field_2._M_local_buf[0] = '_';
                local_b0.field_2._M_allocated_capacity._1_2_ = 0x7562;
                local_b0.field_2._M_local_buf[3] = 'c';
                local_b0._M_string_length = 7;
                local_b0.field_2._M_local_buf[7] = '\0';
                local_d0._M_string_length = 2;
                local_d0.field_2._M_allocated_capacity._0_3_ = 0x656c;
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                local_b0._M_dataplus._M_p = (pointer)paVar11;
                anon_unknown_3::WriteHead<double>
                          (out,local_90,pCVar13,&local_b0,&local_d0,extraLabelValue);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != paVar11) {
                  operator_delete(local_b0._M_dataplus._M_p);
                }
                local_68 = (pointer)*extraLabelValue;
                std::ostream::_M_insert<unsigned_long>((ulong)out);
                anon_unknown_3::WriteTail(out,pCVar13);
                pBVar9 = (pointer)(extraLabelValue + 1);
                extraLabelValue = extraLabelValue + 2;
              } while (pBVar9 != pBVar1);
              if ((double)local_68 < INFINITY) goto LAB_0014ceca;
            }
            pCVar13 = pCVar13 + 1;
          } while (pCVar13 != local_48);
        }
        break;
      case Info:
        std::__ostream_insert<char,std::char_traits<char>>(out,"# TYPE ",7);
        pMVar8 = local_90;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(local_90->name)._M_dataplus._M_p,(local_90->name)._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," gauge\n",7);
        pCVar4 = (pMVar8->metric).
                 super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar13 = (pMVar8->metric).
                       super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar13 != pCVar4;
            pCVar13 = pCVar13 + 1) {
          local_b0.field_2._M_local_buf[4] = 'o';
          local_b0.field_2._M_local_buf[0] = '_';
          local_b0.field_2._M_allocated_capacity._1_2_ = 0x6e69;
          local_b0.field_2._M_local_buf[3] = 'f';
          local_b0._M_string_length = 5;
          local_b0.field_2._M_local_buf[5] = '\0';
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_88._M_string_length = 0;
          local_88.field_2._M_allocated_capacity._0_2_ =
               local_88.field_2._M_allocated_capacity._0_2_ & 0xff00;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_88._M_dataplus._M_p = (pointer)paVar11;
          (anonymous_namespace)::WriteHead<std::__cxx11::string>
                    (out,local_90,pCVar13,&local_b0,&local_d0,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar11) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          anon_unknown_3::WriteValue(out,(pCVar13->info).value);
          anon_unknown_3::WriteTail(out,pCVar13);
        }
      }
      pMVar8 = local_90 + 1;
    } while (pMVar8 != local_50);
  }
  std::ios::imbue(local_40);
  std::locale::~locale(local_40);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = local_58;
  std::locale::~locale(local_60);
  return;
}

Assistant:

void TextSerializer::Serialize(std::ostream& out,
                               const std::vector<MetricFamily>& metrics) const {
  auto saved_locale = out.getloc();
  auto saved_precision = out.precision();

  out.imbue(std::locale::classic());
  out.precision(std::numeric_limits<double>::max_digits10 - 1);

  for (auto& family : metrics) {
    SerializeFamily(out, family);
  }

  out.imbue(saved_locale);
  out.precision(saved_precision);
}